

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O3

void __thiscall mjs::value_representation::value_representation(value_representation *this,value *v)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  wostringstream woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  switch((ulong)v->type_) {
  case 0:
  case 1:
    uVar3 = ((ulong)v->type_ << 0x30) + 0x1000000000000;
    uVar1 = 0x7ff0000000000000;
    break;
  case 2:
    uVar3 = (ulong)(v->field_1).b_;
    uVar1 = 0x7ff3000000000000;
    break;
  case 3:
    dVar2 = (v->field_1).n_;
    if (NAN(dVar2)) {
      dVar2 = NAN;
    }
    goto LAB_0015f4ae;
  case 4:
    uVar3 = (ulong)*(uint *)((long)&v->field_1 + 8);
    uVar1 = 0x7ff5000000000000;
    break;
  case 5:
    uVar3 = (ulong)*(uint *)((long)&v->field_1 + 8);
    uVar1 = 0x7ff6000000000000;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_188);
    std::operator<<((wostream *)local_188,"Not handled: ");
    debug_print((wostream *)local_188,v,2,0x7fffffff,0);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x38);
  }
  dVar2 = (double)(uVar1 | uVar3);
LAB_0015f4ae:
  this->repr_ = (uint64_t)dVar2;
  return;
}

Assistant:

value_representation::value_representation(const value& v) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      repr_ = make_repr(v.type(), 0); return;
    case value_type::boolean:   repr_ = make_repr(v.type(), v.boolean_value()); return;
    case value_type::number:    repr_ = number_repr(v.number_value()); return;
    case value_type::string:    repr_ = make_repr(v.type(), v.string_value().unsafe_raw_get().pos_); return;
    case value_type::object:    repr_ = make_repr(v.type(), v.object_value().pos_); return;
    case value_type::reference: break; // Not legal here
    }
    std::wostringstream woss;
    woss << "Not handled: ";
    debug_print(woss, v, 2);
    THROW_RUNTIME_ERROR(woss.str());
}